

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

bool __thiscall trun::Process::ExecuteAndWait(Process *this)

{
  Process_Unix *this_00;
  bool bVar1;
  string sStack_38;
  
  this_00 = &this->process;
  bVar1 = Process_Unix::PrepareFileDescriptors(this_00);
  if (((bVar1) && (bVar1 = Process_Unix::CreatePipes(this_00), bVar1)) &&
     (bVar1 = Process_Unix::Duplicate(this_00), bVar1)) {
    std::__cxx11::string::string((string *)&sStack_38,&this->command);
    bVar1 = Process_Unix::SpawnAndLoop
                      (this_00,&sStack_38,&this->arguments,&this->super_ProcessCallbackBase);
    std::__cxx11::string::~string((string *)&sStack_38);
    return bVar1;
  }
  return false;
}

Assistant:

bool Process::ExecuteAndWait() {
	if (!process.PrepareFileDescriptors()) return false;
	if (!process.CreatePipes()) return false;
	if (!process.SetNonBlocking()) return false;
	if (!process.Duplicate()) return false;
	return process.SpawnAndLoop(command, arguments, dynamic_cast<ProcessCallbackBase *>(this));
}